

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O0

void initStdConnTable(void)

{
  int local_14;
  StdResConnTableEntry_t *pSStack_10;
  int i;
  StdResConnTableEntry_t *r;
  
  for (local_14 = 0; local_14 < 0xa39; local_14 = local_14 + 1) {
    StdResTblBucket[local_14] = (StdResConnTableEntry_t *)0x0;
  }
  for (pSStack_10 = StandardResAtomConnRec; pSStack_10->key != (char *)0x0;
      pSStack_10 = pSStack_10 + 1) {
    InsertInStdResConnTable(pSStack_10);
  }
  return;
}

Assistant:

void initStdConnTable() {
   StdResConnTableEntry_t *r;
   int i;

   for (i = 0; i < M; i++) { /* empty all the buckets */
      StdResTblBucket[i] = NULL;
   }

   for( r = StandardResAtomConnRec; r->key != NULL; r++) {
      InsertInStdResConnTable(r);
   }
}